

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O2

void __thiscall
cmdline::parser::option_with_value<bool>::~option_with_value(option_with_value<bool> *this)

{
  (this->super_option_base)._vptr_option_base = (_func_int **)&PTR__option_with_value_00149998;
  std::__cxx11::string::~string((string *)&this->desc);
  std::__cxx11::string::~string((string *)&this->nam);
  return;
}

Assistant:

~option_with_value(){}